

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void set_to_vec(void *av)

{
  uint uVar1;
  uint local_44;
  uint i;
  AbstractVec vv;
  AbstractVec *v;
  void *av_local;
  
  uVar1 = *av;
  vv._0_8_ = *(undefined8 *)((long)av + 8);
  if (*(long *)((long)av + 8) == (long)av + 0x10) {
    vv.v = *(void ***)((long)av + 0x10);
    vv.e[0] = *(void **)((long)av + 0x18);
    vv.e[1] = *(void **)((long)av + 0x20);
    vv._0_8_ = &vv.v;
  }
  *(undefined4 *)av = 0;
  *(undefined8 *)((long)av + 8) = 0;
  vv.e[2] = av;
  for (local_44 = 0; local_44 < uVar1; local_44 = local_44 + 1) {
    if (*(long *)(vv._0_8_ + (ulong)local_44 * 8) != 0) {
      vec_add_internal(vv.e[2],*(void **)(vv._0_8_ + (ulong)local_44 * 8));
    }
  }
  free((void *)vv._0_8_);
  return;
}

Assistant:

void set_to_vec(void *av) {
  AbstractVec *v = (AbstractVec *)av, vv;
  uint i;

  vv.n = v->n;
  vv.v = v->v;
  if (v->v == v->e) {
    memcpy(vv.e, v->e, sizeof(v->e));
    vv.v = vv.e;
  }
  v->n = 0;
  v->v = 0;
  for (i = 0; i < vv.n; i++)
    if (vv.v[i]) vec_add_internal(v, vv.v[i]);
  FREE(vv.v);
}